

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# machine_6502.cc
# Opt level: O0

void __thiscall testbench::machine_6502::machine_6502(machine_6502 *this)

{
  pointer __p;
  machine_6502 *this_local;
  
  machine_implementation::machine_implementation(&this->super_machine_implementation);
  (this->super_machine_implementation).super_machine._vptr_machine = (_func_int **)&PTR_run_001188d8
  ;
  memory::memory(&this->memory);
  std::mutex::mutex(&this->mutex);
  __p = (pointer)chipemu::MOS6502::create();
  std::unique_ptr<chipemu::MOS6502,std::default_delete<chipemu::MOS6502>>::
  unique_ptr<std::default_delete<chipemu::MOS6502>,void>
            ((unique_ptr<chipemu::MOS6502,std::default_delete<chipemu::MOS6502>> *)&this->CPU_6502,
             __p);
  return;
}

Assistant:

machine_6502::machine_6502():
    CPU_6502(MOS6502::create())
{}